

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24d90a::BuildSystemFrontendImpl::resetAfterBuild(BuildSystemFrontendImpl *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->stateMutex);
  if (iVar1 == 0) {
    this->cancelled = false;
    pthread_mutex_unlock((pthread_mutex_t *)&this->stateMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void resetAfterBuild() {
    std::lock_guard<std::mutex> lock(stateMutex);
    cancelled = false;
  }